

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream_reader.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
BitstreamReader::unpack_vector<unsigned_char>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          BitstreamReader *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_28 = in_RAX;
  uVar2 = unpack_from<unsigned_short>(this);
  if (uVar2 != 0) {
    do {
      uVar1 = unpack_from<unsigned_char>(this);
      uStack_28 = CONCAT17(uVar1,(undefined7)uStack_28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,(uchar *)((long)&uStack_28 + 7));
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> unpack_vector()
    {
        std::vector<T> ret;

        uint16_t vector_size = this->unpack<uint16_t>();
        for(uint16_t i=0 ; i<vector_size ; ++i)
            ret.emplace_back(this->unpack<T>());

        return ret;
    }